

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_TVFS.cpp
# Opt level: O3

int __thiscall
TRootHandler_TVFS::CaptureVfsSpanEntries
          (TRootHandler_TVFS *this,TVFS_DIRECTORY_HEADER *DirHeader,PENCODED_KEY pEKey,
          PDWORD PtrSpanSize,DWORD dwVfsOffset)

{
  DWORD DVar1;
  DWORD DVar2;
  LPBYTE pBVar3;
  int iVar4;
  LPBYTE pBVar5;
  LPBYTE pbTemp;
  LPBYTE local_38;
  
  local_38 = (LPBYTE)0x0;
  iVar4 = 0x16;
  if (dwVfsOffset <= DirHeader->VfsTableSize) {
    pBVar5 = DirHeader->pbDirectoryData + (ulong)dwVfsOffset + (ulong)DirHeader->VfsTableOffset;
    iVar4 = 1000;
    if (0x1f < (byte)(*pBVar5 + 0x1f)) {
      if (*pBVar5 != '\x01') {
        __assert_fail("dwSpanCount == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_TVFS.cpp"
                      ,0x106,
                      "int TRootHandler_TVFS::CaptureVfsSpanEntries(TVFS_DIRECTORY_HEADER &, PENCODED_KEY, PDWORD, DWORD)"
                     );
      }
      pBVar3 = CaptureArray_(pBVar5 + 1,
                             DirHeader->pbDirectoryData +
                             (ulong)DirHeader->VfsTableSize + (ulong)DirHeader->VfsTableOffset,
                             &local_38,(ulong)DirHeader->CftOffsSize + 8,1);
      if (pBVar3 != (LPBYTE)0x0) {
        DVar1 = ConvertBytesToInteger_X(pBVar5 + 9,DirHeader->CftOffsSize);
        DVar2 = ConvertBytesToInteger_4(pBVar5 + 5);
        pBVar5 = DirHeader->pbDirectoryData + (ulong)DVar1 + (ulong)DirHeader->CftTableOffset;
        if (pBVar5 + DirHeader->EKeySize <=
            DirHeader->pbDirectoryData +
            (ulong)DirHeader->CftTableSize + (ulong)DirHeader->CftTableOffset) {
          memcpy(pEKey,pBVar5,(ulong)DirHeader->EKeySize);
          *PtrSpanSize = DVar2;
          iVar4 = 0;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int CaptureVfsSpanEntries(TVFS_DIRECTORY_HEADER & DirHeader, PENCODED_KEY pEKey, PDWORD PtrSpanSize, DWORD dwVfsOffset)
    {
        LPBYTE pbVfsFileTable = DirHeader.pbDirectoryData + DirHeader.VfsTableOffset;
        LPBYTE pbVfsFileEntry = pbVfsFileTable + dwVfsOffset;
        LPBYTE pbVfsFileEnd = pbVfsFileTable + DirHeader.VfsTableSize;
        LPBYTE pbCftFileTable;
        LPBYTE pbCftFileEntry;
        LPBYTE pbCftFileEnd;
        LPBYTE pbTemp = NULL;
        size_t ItemSize = sizeof(DWORD) + sizeof(DWORD) + DirHeader.CftOffsSize;
        DWORD dwCftOffset;
        DWORD dwSpanCount;
        DWORD dwSpanSize;

        // Get the number of span entries
        if(!(pbVfsFileTable <= pbVfsFileEntry && pbVfsFileEntry <= pbVfsFileEnd))
            return ERROR_INVALID_PARAMETER;
        dwSpanCount = *pbVfsFileEntry++;

        // 1 - 224 = valid file, 225-254 = other file, 255 = deleted file
        // We will ignore all files with unsupported span count
        if(dwSpanCount == 0 || dwSpanCount > 224)
            return ERROR_BAD_FORMAT;

        // So far we've only saw entries with 1 span.
        // Need to test files with multiple spans. Ignore such files for now.
        assert(dwSpanCount == 1);

        // Capture the array of span items
        if(CaptureArray_(pbVfsFileEntry, pbVfsFileEnd, &pbTemp, ItemSize, dwSpanCount) == NULL)
            return ERROR_BAD_FORMAT;

        //
        // Structure of the span entry:
        // (4bytes): Offset into the referenced file (big endian)
        // (4bytes): Size of the span (big endian)
        // (?bytes): Offset into Container File Table. Length depends on container file table size
        //

        // Get the offset to the Container File Table
        dwCftOffset = ConvertBytesToInteger_X(pbVfsFileEntry + sizeof(DWORD) + sizeof(DWORD), DirHeader.CftOffsSize);
        dwSpanSize = ConvertBytesToInteger_4(pbVfsFileEntry + sizeof(DWORD));

        // Go to the Container File Table and fetch the EKey from there
        pbCftFileTable = DirHeader.pbDirectoryData + DirHeader.CftTableOffset;
        pbCftFileEntry = pbCftFileTable + dwCftOffset;
        pbCftFileEnd = pbCftFileTable + DirHeader.CftTableSize;
        if((pbCftFileEntry + DirHeader.EKeySize) > pbCftFileEnd)
            return ERROR_BAD_FORMAT;

        // Give the pointer to the EKey
        memcpy(pEKey->Value, pbCftFileEntry, DirHeader.EKeySize);
        PtrSpanSize[0] = dwSpanSize;
        return ERROR_SUCCESS;
    }